

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

uint32_t __thiscall cfd::Psbt::GetTxInIndex(Psbt *this,OutPoint *outpoint)

{
  uint32_t uVar1;
  long in_RDI;
  undefined1 local_30 [48];
  
  cfd::core::OutPoint::GetTxid();
  cfd::core::OutPoint::GetVout();
  uVar1 = cfd::core::Transaction::GetTxInIndex((Txid *)(in_RDI + 0x10),(uint)local_30);
  core::Txid::~Txid((Txid *)0x3c378e);
  return uVar1;
}

Assistant:

uint32_t Psbt::GetTxInIndex(const OutPoint& outpoint) const {
  return base_tx_.GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
}